

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O2

StringBlock * google::protobuf::internal::StringBlock::New(StringBlock *next)

{
  ushort uVar1;
  StringBlock *pSVar2;
  ushort uVar3;
  
  if (next == (StringBlock *)0x0) {
    uVar1 = 0x100;
    uVar3 = 0x100;
  }
  else {
    uVar1 = next->next_size_;
    uVar3 = 0x2000;
    if ((ushort)(uVar1 * 2) < 0x2000) {
      uVar3 = uVar1 * 2;
    }
  }
  uVar1 = uVar1 - (uVar1 & 0x1f ^ 0x10);
  pSVar2 = (StringBlock *)operator_new((ulong)uVar1);
  pSVar2->next_ = next;
  pSVar2->allocated_size_ = uVar1;
  pSVar2->next_size_ = uVar3;
  pSVar2->heap_allocated_ = true;
  return pSVar2;
}

Assistant:

inline StringBlock* StringBlock::New(StringBlock* next) {
  // Compute required size, rounding down to a multiple of sizeof(std:string)
  // so that we can optimize the allocation path. I.e., we incur a (constant
  // size) MOD() operation cost here to avoid any MUL() later on.
  size_type size = min_size();
  size_type next_size = min_size();
  if (next) {
    size = next->next_size_;
    next_size = std::min<size_type>(size * 2, max_size());
  }
  size = RoundedSize(size);
  void* p = ::operator new(size);
  return new (p) StringBlock(next, true, size, next_size);
}